

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.hpp
# Opt level: O0

bool UTF_U_to_u<(char)63>(UTF_US32 *us32,UTF_US16 *us16)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  local_30;
  const_iterator end;
  const_iterator it;
  UTF_UC16 uc16 [2];
  UTF_US16 *us16_local;
  UTF_US32 *us32_local;
  
  __gnu_cxx::
  __normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  ::__normal_iterator(&end);
  local_30._M_current =
       (char32_t *)
       std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
       end(us32);
  end = std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::begin(us32);
  while (bVar1 = __gnu_cxx::operator!=(&end,&local_30), bVar1) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
             ::operator*(&end);
    bVar1 = UTF_uc32_to_uc16(*pcVar2,(UTF_UC16 *)((long)&it._M_current + 4));
    if (bVar1) {
      std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
      push_back(us16,it._M_current._4_2_);
      if (it._M_current._6_2_ != L'\0') {
        std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
        ::push_back(us16,it._M_current._6_2_);
      }
    }
    else {
      std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
      push_back(us16,L'?');
    }
    __gnu_cxx::
    __normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
    ::operator++(&end);
  }
  return true;
}

Assistant:

inline bool
UTF_U_to_u(const UTF_US32& us32, UTF_US16& us16)
{
    UTF_UC16 uc16[2];
    UTF_US32::const_iterator it, end = us32.end();
    for (it = us32.begin(); it != end; ++it)
    {
        if (!UTF_uc32_to_uc16(*it, uc16))
        {
            if (!t_default_char)
                return false;

            us16.push_back(UTF_STATIC_CAST(UTF_UC8, t_default_char));
            continue;
        }

        us16.push_back(uc16[0]);
        if (uc16[1])
        {
            us16.push_back(uc16[1]);
        }
    }

    return true;
}